

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# container_memory.h
# Opt level: O3

size_t absl::lts_20240722::container_internal::
       TypeErasedApplyToSlotFn<google::protobuf::(anonymous_namespace)::DescriptorsByNameHash<google::protobuf::Descriptor>,google::protobuf::Descriptor_const*>
                 (void *fn,void *slot)

{
  size_t size;
  undefined1 auVar1 [16];
  MixingHashState MVar2;
  uint64_t v;
  
  size = (*(undefined8 **)(*slot + 8))[1];
  MVar2 = hash_internal::MixingHashState::combine_contiguous
                    ((MixingHashState)&hash_internal::MixingHashState::kSeed,
                     (uchar *)**(undefined8 **)(*slot + 8),size);
  auVar1._8_8_ = 0;
  auVar1._0_8_ = MVar2.state_ + size;
  return SUB168(auVar1 * ZEXT816(0x9ddfea08eb382d69),0) ^
         SUB168(auVar1 * ZEXT816(0x9ddfea08eb382d69),8);
}

Assistant:

size_t TypeErasedApplyToSlotFn(const void* fn, void* slot) {
  const auto* f = static_cast<const Fn*>(fn);
  return (*f)(*static_cast<const T*>(slot));
}